

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_ctx_free(lyxml_ctx *xmlctx)

{
  lyxml_ctx *xmlctx_local;
  
  if (xmlctx != (lyxml_ctx *)0x0) {
    ly_log_location_revert(0,0,0,1);
    if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) &&
       ((xmlctx->field_6).dynamic != '\0')) {
      free((xmlctx->field_3).prefix);
    }
    ly_set_erase(&xmlctx->elements,free);
    lyxml_ns_rm_all(xmlctx);
    free(xmlctx);
  }
  return;
}

Assistant:

void
lyxml_ctx_free(struct lyxml_ctx *xmlctx)
{
    if (!xmlctx) {
        return;
    }

    ly_log_location_revert(0, 0, 0, 1);

    if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) && xmlctx->dynamic) {
        free((char *)xmlctx->value);
    }
    ly_set_erase(&xmlctx->elements, free);
    lyxml_ns_rm_all(xmlctx);
    free(xmlctx);
}